

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

ssize_t __thiscall DataStream::read(DataStream *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  ulong uVar2;
  unsigned_long uVar3;
  bool bVar4;
  size_t sVar5;
  unsigned_long *puVar6;
  size_type sVar7;
  char *pcVar8;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *this_00;
  reference __src;
  long in_FS_OFFSET;
  optional<unsigned_long> next_read_pos;
  Span<std::byte> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  io_errc in_stack_ffffffffffffff64;
  error_code *in_stack_ffffffffffffff68;
  unsigned_long in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar5 = Span<std::byte>::size(in_stack_ffffffffffffff58);
  if (sVar5 == 0) {
LAB_002f6810:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    Span<std::byte>::size(in_stack_ffffffffffffff58);
    CheckedAdd<unsigned_long>(in_stack_ffffffffffffff70,(unsigned_long)in_stack_ffffffffffffff68);
    bVar4 = std::optional<unsigned_long>::has_value
                      ((optional<unsigned_long> *)in_stack_ffffffffffffff58);
    if (bVar4) {
      puVar6 = std::optional<unsigned_long>::value
                         ((optional<unsigned_long> *)in_stack_ffffffffffffff68);
      uVar2 = *puVar6;
      sVar7 = std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::size
                        ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                         in_stack_ffffffffffffff58);
      if (uVar2 <= sVar7) {
        this_00 = (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                  Span<std::byte>::data(in_stack_ffffffffffffff58);
        __src = std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::operator[]
                          (this_00,CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        sVar5 = Span<std::byte>::size(in_stack_ffffffffffffff58);
        memcpy(this_00,__src,sVar5);
        puVar6 = std::optional<unsigned_long>::value((optional<unsigned_long> *)this_00);
        uVar3 = *puVar6;
        sVar7 = std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::size
                          ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                           in_stack_ffffffffffffff58);
        if (uVar3 == sVar7) {
          this->m_read_pos = 0;
          std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::clear
                    ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                     in_stack_ffffffffffffff58);
        }
        else {
          puVar6 = std::optional<unsigned_long>::value((optional<unsigned_long> *)this_00);
          this->m_read_pos = *puVar6;
        }
        goto LAB_002f6810;
      }
    }
    pcVar8 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar8,(error_code *)"DataStream::read(): end of data");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar8,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

void read(Span<value_type> dst)
    {
        if (dst.size() == 0) return;

        // Read from the beginning of the buffer
        auto next_read_pos{CheckedAdd(m_read_pos, dst.size())};
        if (!next_read_pos.has_value() || next_read_pos.value() > vch.size()) {
            throw std::ios_base::failure("DataStream::read(): end of data");
        }
        memcpy(dst.data(), &vch[m_read_pos], dst.size());
        if (next_read_pos.value() == vch.size()) {
            m_read_pos = 0;
            vch.clear();
            return;
        }
        m_read_pos = next_read_pos.value();
    }